

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnOpcodeIndex
          (BinaryReaderObjdumpDisassemble *this,Index value)

{
  Enum EVar1;
  ObjdumpState *pOVar2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  long lVar6;
  ObjdumpNames *this_00;
  string_view sVar7;
  key_type local_20;
  
  if (this->in_function_body != true) {
    return (Result)Ok;
  }
  EVar1 = (this->super_BinaryReaderObjdumpBase).current_opcode.enum_;
  if ((int)EVar1 < 0x1c) {
    if (EVar1 - LocalGet < 2) {
      local_20.first = this->current_function_index;
      pOVar2 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
      local_20.second = value;
      cVar3 = std::
              _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&pOVar2->local_names,&local_20);
      if (((_Rb_tree_header *)cVar3._M_node ==
           &(pOVar2->local_names).names._M_t._M_impl.super__Rb_tree_header) ||
         (p_Var4 = cVar3._M_node[1]._M_left, p_Var4 == (_Base_ptr)0x0)) goto LAB_00112e78;
      p_Var5 = cVar3._M_node[1]._M_parent;
    }
    else {
      if (EVar1 == Throw) {
        lVar6 = 0xf0;
        goto LAB_00112e4e;
      }
      if (EVar1 != Call) goto LAB_00112e78;
      this_00 = &((this->super_BinaryReaderObjdumpBase).objdump_state_)->function_names;
LAB_00112e52:
      sVar7 = ObjdumpNames::Get(this_00,value);
      p_Var5 = (_Base_ptr)sVar7._M_str;
      if (sVar7._M_len == 0) goto LAB_00112e78;
      p_Var4 = (_Base_ptr)(ulong)(uint)sVar7._M_len;
    }
    LogOpcode(this,"%d <%.*s>",value,p_Var4,p_Var5);
  }
  else {
    if (EVar1 - GlobalGet < 2) {
      lVar6 = 0x90;
LAB_00112e4e:
      this_00 = (ObjdumpNames *)
                ((long)&(((this->super_BinaryReaderObjdumpBase).objdump_state_)->code_relocations).
                        super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar6);
      goto LAB_00112e52;
    }
LAB_00112e78:
    LogOpcode(this,"%d",value);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeIndex(Index value) {
  if (!in_function_body) {
    return Result::Ok;
  }
  std::string_view name;
  if (current_opcode == Opcode::Call &&
      !(name = GetFunctionName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if (current_opcode == Opcode::Throw &&
             !(name = GetTagName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if ((current_opcode == Opcode::GlobalGet ||
              current_opcode == Opcode::GlobalSet) &&
             !(name = GetGlobalName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if ((current_opcode == Opcode::LocalGet ||
              current_opcode == Opcode::LocalSet) &&
             !(name = GetLocalName(current_function_index, value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else {
    LogOpcode("%d", value);
  }
  return Result::Ok;
}